

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

VarStatus __thiscall
soplex::SPxSolverBase<double>::basisStatusToVarStatus(SPxSolverBase<double> *this,Status stat)

{
  ostream *poVar1;
  SPxInternalCodeException *this_00;
  int in_ESI;
  VarStatus vstat;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [32];
  VarStatus local_10;
  int local_c;
  
  switch(in_ESI) {
  case 1:
  case 2:
  case 4:
  case 6:
  case 8:
    local_10 = BASIC;
    break;
  case -6:
    local_10 = FIXED;
    break;
  default:
    local_c = in_ESI;
    poVar1 = std::operator<<((ostream *)&std::cerr,"ESOLVE26 ERROR: unknown basis status (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"XSOLVE22 This should never happen.",&local_31);
    SPxInternalCodeException::SPxInternalCodeException(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                SPxInternalCodeException::~SPxInternalCodeException);
  case -4:
    local_10 = ON_LOWER;
    break;
  case -2:
    local_10 = ON_UPPER;
    break;
  case -1:
    local_10 = ZERO;
  }
  return local_10;
}

Assistant:

typename SPxSolverBase<R>::VarStatus
   SPxSolverBase<R>::basisStatusToVarStatus(typename SPxBasisBase<R>::Desc::Status stat) const
   {
      VarStatus vstat;

      switch(stat)
      {
      case SPxBasisBase<R>::Desc::P_ON_LOWER:
         vstat = ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER:
         vstat = ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED:
         vstat = FIXED;
         break;

      case SPxBasisBase<R>::Desc::P_FREE:
         vstat = ZERO;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER:
      case SPxBasisBase<R>::Desc::D_ON_LOWER:
      case SPxBasisBase<R>::Desc::D_ON_BOTH:
      case SPxBasisBase<R>::Desc::D_UNDEFINED:
      case SPxBasisBase<R>::Desc::D_FREE:
         vstat = BASIC;
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ESOLVE26 ERROR: unknown basis status (" << static_cast<int>(stat) << ")"
                       << std::endl;)
         throw SPxInternalCodeException("XSOLVE22 This should never happen.");
      }

      return vstat;
   }